

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void Assimp::FBX::anon_unknown_16::ReadBinaryDataArray
               (char type,uint32_t count,char **data,char *end,
               vector<char,_std::allocator<char>_> *buff,Element *param_6)

{
  char *__first;
  uint uVar1;
  uint uVar2;
  int iVar3;
  iterator __result;
  size_type sVar4;
  allocator local_129;
  string local_128;
  int local_104;
  iterator iStack_100;
  int ret;
  allocator local_e1;
  string local_e0;
  char *local_c0;
  z_stream zstream;
  int local_3c;
  uint32_t full_length;
  uint32_t stride;
  uint32_t comp_len;
  uint32_t encmode;
  Element *param_5_local;
  vector<char,_std::allocator<char>_> *buff_local;
  char *end_local;
  char **data_local;
  uint32_t count_local;
  char type_local;
  
  uVar1 = anon_unknown.dwarf_1924db::SafeParse<unsigned_int>(*data,end);
  *data = *data + 4;
  uVar2 = anon_unknown.dwarf_1924db::SafeParse<unsigned_int>(*data,end);
  *data = *data + 4;
  local_3c = 0;
  switch(type) {
  case 'd':
  case 'l':
    local_3c = 8;
    break;
  default:
    break;
  case 'f':
  case 'i':
    local_3c = 4;
  }
  std::vector<char,_std::allocator<char>_>::resize(buff,(ulong)(local_3c * count));
  if (uVar1 == 0) {
    __first = *data;
    __result = std::vector<char,_std::allocator<char>_>::begin(buff);
    std::
    copy<char_const*,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              (__first,end,
               (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
               __result._M_current);
  }
  else if (uVar1 == 1) {
    zstream.zfree = (free_func)0x0;
    zstream.state = (internal_state *)0x0;
    zstream.zalloc = (alloc_func)0x0;
    zstream.opaque._0_4_ = 0;
    iVar3 = inflateInit_(&local_c0,"1.2.11",0x70);
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e0,"failure initializing zlib",&local_e1);
      anon_unknown.dwarf_1924db::ParseError(&local_e0,(Element *)0x0);
    }
    local_c0 = *data;
    zstream.next_in._0_4_ = uVar2;
    sVar4 = std::vector<char,_std::allocator<char>_>::size(buff);
    zstream.next_out._0_4_ = (undefined4)sVar4;
    iStack_100 = std::vector<char,_std::allocator<char>_>::begin(buff);
    zstream.total_in =
         (uLong)__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                operator*(&stack0xffffffffffffff00);
    local_104 = inflate(&local_c0,4);
    if ((local_104 != 1) && (local_104 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_128,"failure decompressing compressed data section",&local_129);
      anon_unknown.dwarf_1924db::ParseError(&local_128,(Element *)0x0);
    }
    inflateEnd(&local_c0);
  }
  *data = *data + uVar2;
  return;
}

Assistant:

void ReadBinaryDataArray(char type, uint32_t count, const char*& data, const char* end,
    std::vector<char>& buff,
    const Element& /*el*/)
{
    BE_NCONST uint32_t encmode = SafeParse<uint32_t>(data, end);
    AI_SWAP4(encmode);
    data += 4;

    // next comes the compressed length
    BE_NCONST uint32_t comp_len = SafeParse<uint32_t>(data, end);
    AI_SWAP4(comp_len);
    data += 4;

    ai_assert(data + comp_len == end);

    // determine the length of the uncompressed data by looking at the type signature
    uint32_t stride = 0;
    switch(type)
    {
        case 'f':
        case 'i':
            stride = 4;
            break;

        case 'd':
        case 'l':
            stride = 8;
            break;

        default:
            ai_assert(false);
    };

    const uint32_t full_length = stride * count;
    buff.resize(full_length);

    if(encmode == 0) {
        ai_assert(full_length == comp_len);

        // plain data, no compression
        std::copy(data, end, buff.begin());
    }
    else if(encmode == 1) {
        // zlib/deflate, next comes ZIP head (0x78 0x01)
        // see http://www.ietf.org/rfc/rfc1950.txt

        z_stream zstream;
        zstream.opaque = Z_NULL;
        zstream.zalloc = Z_NULL;
        zstream.zfree  = Z_NULL;
        zstream.data_type = Z_BINARY;

        // http://hewgill.com/journal/entries/349-how-to-decompress-gzip-stream-with-zlib
        if(Z_OK != inflateInit(&zstream)) {
            ParseError("failure initializing zlib");
        }

        zstream.next_in   = reinterpret_cast<Bytef*>( const_cast<char*>(data) );
        zstream.avail_in  = comp_len;

        zstream.avail_out = static_cast<uInt>(buff.size());
        zstream.next_out = reinterpret_cast<Bytef*>(&*buff.begin());
        const int ret = inflate(&zstream, Z_FINISH);

        if (ret != Z_STREAM_END && ret != Z_OK) {
            ParseError("failure decompressing compressed data section");
        }

        // terminate zlib
        inflateEnd(&zstream);
    }
#ifdef ASSIMP_BUILD_DEBUG
    else {
        // runtime check for this happens at tokenization stage
        ai_assert(false);
    }
#endif

    data += comp_len;
    ai_assert(data == end);
}